

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void check_decl_align(c2m_ctx_t c2m_ctx,decl_spec *decl_spec)

{
  uint uVar1;
  pos_t pVar2;
  
  if (-1 < decl_spec->align) {
    uVar1 = decl_spec->type->align;
    if ((int)uVar1 < 0) {
      __assert_fail("type->align >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x17a0,"int type_align(struct type *)");
    }
    if ((uint)decl_spec->align < uVar1) {
      pVar2 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                           (node_t_conflict)(ulong)decl_spec->align_node->uid);
      error(c2m_ctx,0x1c0830,pVar2.fname,pVar2._8_8_);
      return;
    }
  }
  return;
}

Assistant:

static void check_decl_align (c2m_ctx_t c2m_ctx, struct decl_spec *decl_spec) {
  if (decl_spec->align < 0) return;
  if (decl_spec->align < type_align (decl_spec->type))
    error (c2m_ctx, POS (decl_spec->align_node),
           "requested alignment is less than minimum alignment for the type");
}